

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)48,_(unsigned_short)17>::Unpack
               (uint32_t **in,uint64_t *out)

{
  ushort uVar1;
  uint uVar2;
  uint32_t *puVar3;
  
  puVar3 = *in;
  uVar1 = *(ushort *)((long)puVar3 + 2);
  out[0x11] = (ulong)uVar1;
  *in = puVar3 + 1;
  out[0x11] = (ulong)CONCAT42(puVar3[1],uVar1);
  *in = puVar3 + 2;
  uVar2 = puVar3[2];
  out[0x12] = (ulong)uVar2;
  *in = puVar3 + 3;
  out[0x12] = (ulong)CONCAT24((short)puVar3[3],uVar2);
  Unroller<(unsigned_short)48,_(unsigned_short)19>::Unpack(in,out);
  return;
}

Assistant:

unpack_single_out(const uint32_t *__restrict &in,
                                                                     uint64_t *__restrict out) {
	*out = static_cast<uint64_t>(*in) >> SHR;
	++in;

	*out |= static_cast<uint64_t>(*in) << (32 - SHR);
	++in;

	if (DELTA + SHR > 64) {
		static const uint8_t NEXT_SHR = DELTA + SHR - 64;
		*out |= static_cast<uint64_t>((*in) % (1U << NEXT_SHR)) << (64 - SHR);
	}
}